

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O3

int tcp_listener_listen(void *arg)

{
  nni_mtx *mtx;
  int __fd;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  undefined1 local_b8 [8];
  sockaddr_storage ss;
  int on;
  
  sVar2 = nni_posix_nn2sockaddr(local_b8,(nni_sockaddr *)((long)arg + 0x50));
  iVar1 = 0xf;
  if (((socklen_t)sVar2 != 0) && ((local_b8._0_2_ & 0xfff7) == 2)) {
    mtx = (nni_mtx *)((long)arg + 0x130);
    nni_mtx_lock(mtx);
    if (*(char *)((long)arg + 0x128) == '\x01') {
      nni_mtx_unlock(mtx);
      iVar1 = 0xb;
    }
    else if (*(char *)((long)arg + 0x129) == '\x01') {
      nni_mtx_unlock(mtx);
      iVar1 = 7;
    }
    else {
      __fd = socket((uint)(ushort)local_b8._0_2_,0x80001,0);
      if (__fd < 0) {
        nni_mtx_unlock(mtx);
        piVar3 = __errno_location();
        iVar1 = nni_plat_errno(*piVar3);
      }
      else {
        ss.__ss_align._4_4_ = 1;
        setsockopt(__fd,1,2,(void *)((long)&ss.__ss_align + 4),4);
        iVar1 = bind(__fd,(sockaddr *)local_b8,(socklen_t)sVar2);
        if ((-1 < iVar1) && (iVar1 = listen(__fd,0x80), iVar1 == 0)) {
          nni_posix_pfd_init((nni_posix_pfd *)((long)arg + 0xd8),__fd,tcp_listener_cb,arg);
          *(undefined1 *)((long)arg + 0x128) = 1;
          nni_mtx_unlock(mtx);
          return 0;
        }
        piVar3 = __errno_location();
        iVar1 = nni_plat_errno(*piVar3);
        close(__fd);
        nni_mtx_unlock(mtx);
      }
    }
  }
  return iVar1;
}

Assistant:

static int
tcp_listener_listen(void *arg)
{
	tcp_listener           *l = arg;
	socklen_t               len;
	struct sockaddr_storage ss;
	int                     rv;
	int                     fd;

	if (((len = nni_posix_nn2sockaddr(&ss, &l->sa)) == 0) ||
#ifdef NNG_ENABLE_IPV6
	    ((ss.ss_family != AF_INET) && (ss.ss_family != AF_INET6))
#else
	    (ss.ss_family != AF_INET)
#endif
	) {
		return (NNG_EADDRINVAL);
	}

	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ESTATE);
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}

	if ((fd = socket(ss.ss_family, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		nni_mtx_unlock(&l->mtx);
		return (nni_plat_errno(errno));
	}

// On the Windows Subsystem for Linux, SO_REUSEADDR behaves like Windows
// SO_REUSEADDR, which is almost completely different (and wrong!) from
// traditional SO_REUSEADDR.
#if defined(SO_REUSEADDR) && !defined(NNG_PLATFORM_WSL)
	{
		int on = 1;
		// If for some reason this doesn't work, it's probably ok.
		// Second bind will fail.
		(void) setsockopt(
		    fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on));
	}
#endif

	if (bind(fd, (struct sockaddr *) &ss, len) < 0) {
		rv = nni_plat_errno(errno);
		(void) close(fd);
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	// Listen -- 128 depth is probably sufficient.  If it isn't, other
	// bad things are going to happen.
	if (listen(fd, 128) != 0) {
		rv = nni_plat_errno(errno);
		(void) close(fd);
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	nni_posix_pfd_init(&l->pfd, fd, tcp_listener_cb, l);

	l->started = true;
	nni_mtx_unlock(&l->mtx);

	return (0);
}